

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringprintf.cc
# Opt level: O0

void google::protobuf::StringAppendV(string *dst,char *format,__va_list_tag *ap)

{
  int iVar1;
  int iVar2;
  char *__s;
  char *buf;
  int length;
  int result;
  va_list backup_ap;
  char local_428 [8];
  char space [1024];
  __va_list_tag *ap_local;
  char *format_local;
  string *dst_local;
  
  backup_ap[0].overflow_arg_area = ap->reg_save_area;
  length = ap->gp_offset;
  unique0x100000de = ap->fp_offset;
  backup_ap[0]._0_8_ = ap->overflow_arg_area;
  iVar1 = vsnprintf(local_428,0x400,format,&length);
  if (iVar1 < 0x400) {
    if (-1 < iVar1) {
      std::__cxx11::string::append((char *)dst,(ulong)local_428);
      return;
    }
    if (iVar1 < 0) {
      return;
    }
  }
  iVar1 = iVar1 + 1;
  __s = (char *)operator_new__((long)iVar1);
  backup_ap[0].overflow_arg_area = ap->reg_save_area;
  length = ap->gp_offset;
  unique0x100000fe = ap->fp_offset;
  backup_ap[0]._0_8_ = ap->overflow_arg_area;
  iVar2 = vsnprintf(__s,(long)iVar1,format,&length);
  if ((-1 < iVar2) && (iVar2 < iVar1)) {
    std::__cxx11::string::append((char *)dst,(ulong)__s);
  }
  if (__s != (char *)0x0) {
    operator_delete__(__s);
  }
  return;
}

Assistant:

void StringAppendV(string* dst, const char* format, va_list ap) {
  // First try with a small fixed size buffer
  static const int kSpaceLength = 1024;
  char space[kSpaceLength];

  // It's possible for methods that use a va_list to invalidate
  // the data in it upon use.  The fix is to make a copy
  // of the structure before using it and use that copy instead.
  va_list backup_ap;
  va_copy(backup_ap, ap);
  int result = vsnprintf(space, kSpaceLength, format, backup_ap);
  va_end(backup_ap);

  if (result < kSpaceLength) {
    if (result >= 0) {
      // Normal case -- everything fit.
      dst->append(space, result);
      return;
    }

    if (IS_COMPILER_MSVC) {
      // Error or MSVC running out of space.  MSVC 8.0 and higher
      // can be asked about space needed with the special idiom below:
      va_copy(backup_ap, ap);
      result = vsnprintf(NULL, 0, format, backup_ap);
      va_end(backup_ap);
    }

    if (result < 0) {
      // Just an error.
      return;
    }
  }

  // Increase the buffer size to the size requested by vsnprintf,
  // plus one for the closing \0.
  int length = result+1;
  char* buf = new char[length];

  // Restore the va_list before we use it again
  va_copy(backup_ap, ap);
  result = vsnprintf(buf, length, format, backup_ap);
  va_end(backup_ap);

  if (result >= 0 && result < length) {
    // It fit
    dst->append(buf, result);
  }
  delete[] buf;
}